

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmzz2;
  double Jmyy2;
  double mass_phi2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmzz1;
  double Jmyy1;
  double mass_phi1;
  DampingCoefficients rdamping_coeff2;
  DampingCoefficients rdamping_coeff1;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  if (this->compute_ave_sec_par == false) {
    dVar9 = (double)(**(code **)((long)(((this->sectionA).
                                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                       super_ChBeamSectionEulerAdvancedGeneric.
                                       super_ChBeamSectionEuler.super_ChBeamSection.
                                       _vptr_ChBeamSection + 0x58))();
    dVar10 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x178))();
    dVar11 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    dVar12 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar13 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar14 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar15 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar16 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    dVar17 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x20))();
    dVar18 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    dVar19 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    dVar20 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    dVar21 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x30))();
    dVar22 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x38))();
    dVar23 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x40))();
    dVar24 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x48))();
    dVar25 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x50))();
    peVar2 = (this->sectionA).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar52 = (peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
             super_ChBeamSectionEulerAdvancedGeneric.My;
    dVar50 = (peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
             super_ChBeamSectionEulerAdvancedGeneric.Mz;
    (**(code **)((long)(peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar2,&local_70,&local_78,&local_80,&local_68,&local_88,&local_90);
    dVar26 = cos(local_68);
    dVar27 = sin(local_68);
    (**(code **)((long)(((this->sectionA).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_38);
    dVar28 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x1a8))();
    dVar29 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x58))();
    dVar30 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x178))();
    dVar31 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    dVar32 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar33 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar34 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar35 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar36 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    dVar37 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x20))();
    dVar38 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    dVar39 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    dVar40 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    dVar41 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x30))();
    dVar42 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x38))();
    dVar43 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x40))();
    dVar44 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x48))();
    dVar45 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x50))();
    peVar2 = (this->sectionB).
             super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar51 = (peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
             super_ChBeamSectionEulerAdvancedGeneric.My;
    dVar49 = (peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
             super_ChBeamSectionEulerAdvancedGeneric.Mz;
    (**(code **)((long)(peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar2,&local_a0,&local_a8,&local_b0,&local_98,&local_b8,&local_c0);
    dVar46 = cos(local_98);
    dVar47 = sin(local_98);
    (**(code **)((long)(((this->sectionB).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_60);
    dVar48 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x1a8))();
    dVar1 = this->length;
    peVar3 = (this->avg_sec_par).
             super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->mu = (dVar29 + dVar9) * 0.5;
    peVar3->alpha = (dVar41 + dVar21) * 0.5;
    peVar3->Cy = (dVar42 + dVar22) * 0.5;
    peVar3->Cz = (dVar43 + dVar23) * 0.5;
    peVar3->Sy = (dVar44 + dVar24) * 0.5;
    peVar3->Sz = (dVar45 + dVar25) * 0.5;
    peVar3->My = (dVar52 + dVar51) * 0.5;
    peVar3->Mz = (dVar50 + dVar49) * 0.5;
    dVar52 = dVar10 * dVar30;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar10 * dVar10 * dVar10 * dVar30,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar30 * dVar30 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar10 + dVar30) / 5.0;
    }
    else {
      dVar52 = (dVar10 + dVar30) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jyy = dVar52;
    dVar52 = dVar11 * dVar31;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar11 * dVar11 * dVar11 * dVar31,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar31 * dVar31 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar11 + dVar31) / 5.0;
    }
    else {
      dVar52 = (dVar11 + dVar31) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jzz = dVar52;
    dVar52 = dVar12 * dVar32;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar12 * dVar12 * dVar12 * dVar32,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar32 * dVar32 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar12 + dVar32) / 5.0;
    }
    else {
      dVar52 = (dVar12 + dVar32) * 0.5;
    }
    peVar3 = (this->avg_sec_par).
             super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->Jyz = dVar52;
    peVar3->Jxx = peVar3->Jyy + peVar3->Jzz;
    if (0.0 <= dVar13 * dVar33) {
      dVar52 = pow(dVar13 * dVar33,0.5);
      dVar52 = (dVar52 + dVar13 + dVar33) / 3.0;
    }
    else {
      dVar52 = (dVar13 + dVar33) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Qy = dVar52;
    if (0.0 <= dVar14 * dVar34) {
      dVar52 = pow(dVar14 * dVar34,0.5);
      dVar52 = (dVar52 + dVar14 + dVar34) / 3.0;
    }
    else {
      dVar52 = (dVar14 + dVar34) * 0.5;
    }
    peVar3 = (this->avg_sec_par).
             super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->Qz = dVar52;
    peVar3->mass_phi = (local_68 + local_98) * 0.5;
    dVar52 = local_70 * local_a0;
    if (0.0 <= dVar52) {
      dVar50 = pow(local_a0 * local_70 * local_70 * local_70,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(local_a0 * local_a0 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + local_70 + local_a0) / 5.0;
    }
    else {
      dVar52 = (local_70 + local_a0) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jmyy = dVar52;
    dVar52 = local_78 * local_a8;
    if (0.0 <= dVar52) {
      dVar50 = pow(local_a8 * local_78 * local_78 * local_78,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(local_a8 * local_a8 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + local_78 + local_a8) / 5.0;
    }
    else {
      dVar52 = (local_78 + local_a8) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jmzz = dVar52;
    dVar52 = local_80 * local_b0;
    if (0.0 <= dVar52) {
      dVar50 = pow(local_b0 * local_80 * local_80 * local_80,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(local_b0 * local_b0 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + local_80 + local_b0) / 5.0;
    }
    else {
      dVar52 = (local_80 + local_b0) * 0.5;
    }
    peVar3 = (this->avg_sec_par).
             super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->Jmyz = dVar52;
    peVar3->Jmxx = peVar3->Jmyy + peVar3->Jmzz;
    if (0.0 <= local_88 * local_b8) {
      dVar52 = pow(local_88 * local_b8,0.5);
      dVar52 = (dVar52 + local_88 + local_b8) / 3.0;
    }
    else {
      dVar52 = (local_88 + local_b8) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Qmy = dVar52;
    if (0.0 <= local_90 * local_c0) {
      dVar52 = pow(local_90 * local_c0,0.5);
      dVar52 = (dVar52 + local_90 + local_c0) / 3.0;
    }
    else {
      dVar52 = (local_90 + local_c0) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Qmz = dVar52;
    if (0.0 <= dVar15 * dVar35) {
      dVar52 = pow(dVar15 * dVar35,0.5);
      dVar52 = (dVar52 + dVar15 + dVar35) / 3.0;
    }
    else {
      dVar52 = (dVar15 + dVar35) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EA = dVar52;
    if (0.0 <= dVar16 * dVar36) {
      dVar52 = pow(dVar16 * dVar36,0.5);
      dVar52 = (dVar52 + dVar16 + dVar36) / 3.0;
    }
    else {
      dVar52 = (dVar16 + dVar36) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GJ = dVar52;
    dVar52 = dVar19 * dVar39;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar19 * dVar19 * dVar19 * dVar39,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar52 * dVar39 * dVar39,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar19 + dVar39) / 5.0;
    }
    else {
      dVar52 = (dVar19 + dVar39) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAyy = dVar52;
    dVar52 = dVar20 * dVar40;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar20 * dVar20 * dVar20 * dVar40,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar52 * dVar40 * dVar40,0.25);
      dVar52 = (dVar40 + dVar52 + dVar51 + dVar50 + dVar20) / 5.0;
    }
    else {
      dVar52 = (dVar20 + dVar40) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAzz = dVar52;
    dVar52 = dVar17 * dVar37;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar17 * dVar17 * dVar17 * dVar37,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar37 * dVar37 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar17 + dVar37) / 5.0;
    }
    else {
      dVar52 = (dVar17 + dVar37) * 0.5;
    }
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar40 * dVar47;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar20 * dVar27;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar19;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar39;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar26;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar46;
    auVar8 = vfmadd231sd_fma(auVar78,auVar59,auVar8);
    dVar51 = auVar8._0_8_;
    auVar8 = vfmadd231sd_fma(auVar75,auVar69,auVar66);
    dVar50 = auVar8._0_8_;
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EIyy = dVar52;
    dVar52 = dVar18 * dVar38;
    if (0.0 <= dVar52) {
      dVar49 = pow(dVar18 * dVar18 * dVar18 * dVar38,0.25);
      dVar9 = pow(dVar52,0.5);
      dVar52 = pow(dVar52 * dVar38 * dVar38,0.25);
      dVar52 = (dVar38 + dVar52 + dVar9 + dVar49 + dVar18) / 5.0;
    }
    else {
      dVar52 = (dVar18 + dVar38) * 0.5;
    }
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar19;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar39;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar20 * dVar26;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar27;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar47;
    auVar8 = vfnmadd213sd_fma(auVar60,auVar53,auVar79);
    dVar49 = auVar8._0_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar40 * dVar46;
    auVar8 = vfnmadd213sd_fma(auVar70,auVar67,auVar72);
    dVar9 = auVar8._0_8_;
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EIzz = dVar52;
    dVar52 = dVar51 * dVar50;
    if (0.0 <= dVar52) {
      dVar10 = pow(dVar50 * dVar51 * dVar51 * dVar51,0.25);
      dVar11 = pow(dVar52,0.5);
      dVar52 = pow(dVar50 * dVar50 * dVar52,0.25);
      dVar52 = (dVar52 + dVar11 + dVar10 + dVar51 + dVar50) / 5.0;
    }
    else {
      dVar52 = (dVar51 + dVar50) * 0.5;
    }
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar38 * dVar47;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar18 * dVar27;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar17;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar26;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar46;
    auVar8 = vfmadd231sd_fma(auVar77,auVar54,auVar68);
    dVar51 = auVar8._0_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar37;
    auVar8 = vfmadd231sd_fma(auVar74,auVar64,auVar73);
    dVar50 = auVar8._0_8_;
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAmyy = dVar52;
    dVar52 = dVar49 * dVar9;
    if (0.0 <= dVar52) {
      dVar10 = pow(dVar49 * dVar49 * dVar49 * dVar9,0.25);
      dVar11 = pow(dVar52,0.5);
      dVar52 = pow(dVar9 * dVar9 * dVar52,0.25);
      dVar52 = (dVar52 + dVar11 + dVar10 + dVar49 + dVar9) / 5.0;
    }
    else {
      dVar52 = (dVar49 + dVar9) * 0.5;
    }
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar17;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar37;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar38 * dVar46;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar18 * dVar26;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar27;
    auVar8 = vfnmadd213sd_fma(auVar61,auVar55,auVar76);
    dVar9 = auVar8._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar47;
    auVar8 = vfnmadd213sd_fma(auVar62,auVar65,auVar71);
    dVar49 = auVar8._0_8_;
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAmzz = dVar52;
    dVar52 = dVar51 * dVar50;
    if (0.0 <= dVar52) {
      dVar10 = pow(dVar50 * dVar51 * dVar51 * dVar51,0.25);
      dVar11 = pow(dVar52,0.5);
      dVar52 = pow(dVar50 * dVar50 * dVar52,0.25);
      dVar52 = (dVar52 + dVar11 + dVar10 + dVar51 + dVar50) / 5.0;
    }
    else {
      dVar52 = (dVar51 + dVar50) * 0.5;
    }
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EImyy = dVar52;
    dVar52 = dVar9 * dVar49;
    if (0.0 <= dVar52) {
      dVar50 = pow(dVar9 * dVar9 * dVar9 * dVar49,0.25);
      dVar51 = pow(dVar52,0.5);
      dVar52 = pow(dVar49 * dVar49 * dVar52,0.25);
      dVar52 = (dVar52 + dVar51 + dVar50 + dVar9 + dVar49) / 5.0;
    }
    else {
      dVar52 = (dVar9 + dVar49) * 0.5;
    }
    dVar1 = dVar1 * dVar1;
    peVar3 = (this->avg_sec_par).
             super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->EImzz = dVar52;
    (peVar3->rdamping_coeff).bx = (local_38 + local_60) * 0.5;
    (peVar3->rdamping_coeff).by = (local_30 + local_58) * 0.5;
    (peVar3->rdamping_coeff).bz = (local_28 + local_50) * 0.5;
    (peVar3->rdamping_coeff).bt = (local_20 + local_48) * 0.5;
    (peVar3->rdamping_coeff).alpha = (local_18 + local_40) * 0.5;
    peVar3->artificial_factor_for_shear_damping = (dVar48 + dVar28) * 0.5;
    peVar3->phimy = 0.0;
    peVar3->phimz = 0.0;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = peVar3->GAmyy;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar63,auVar4);
    if (0.01 < auVar8._0_8_) {
      peVar3->phimy = (dVar52 * 12.0) / (dVar1 * peVar3->GAmyy);
    }
    auVar56._8_8_ = 0;
    auVar56._0_8_ = peVar3->GAmzz;
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar56,auVar5);
    if (0.01 < auVar8._0_8_) {
      peVar3->phimz = (peVar3->EImyy * 12.0) / (dVar1 * peVar3->GAmzz);
    }
    peVar3->phiy = 0.0;
    peVar3->phiz = 0.0;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = peVar3->GAyy;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar57,auVar6);
    if (0.01 < auVar8._0_8_) {
      peVar3->phiy = (peVar3->EIzz * 12.0) / (dVar1 * peVar3->GAyy);
    }
    auVar58._8_8_ = 0;
    auVar58._0_8_ = peVar3->GAzz;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar58,auVar7);
    if (0.01 < auVar8._0_8_) {
      peVar3->phiz = (peVar3->EIyy * 12.0) / (dVar1 * peVar3->GAzz);
    }
    this->compute_ave_sec_par = true;
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters() {
    if (compute_ave_sec_par) {
        return;
    }

    double mu1 = this->sectionA->GetMassPerUnitLength();
    // double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();
    // double Jmxx1 = this->sectionA->GetInertiaJxxPerUnitLengthInMassReference();
    double EA1 = this->sectionA->GetAxialRigidity();
    double GJ1 = this->sectionA->GetXtorsionRigidity();
    double EIyy1 = this->sectionA->GetYbendingRigidity();
    double EIzz1 = this->sectionA->GetZbendingRigidity();
    double GAyy1 = this->sectionA->GetYshearRigidity();
    double GAzz1 = this->sectionA->GetZshearRigidity();
    double alpha1 = this->sectionA->GetSectionRotation();
    double Cy1 = this->sectionA->GetCentroidY();
    double Cz1 = this->sectionA->GetCentroidZ();
    double Sy1 = this->sectionA->GetShearCenterY();
    double Sz1 = this->sectionA->GetShearCenterZ();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmyy1;
    double Jmzz1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    // double Jmxx1 = Jmyy1 + Jmzz1;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi1 = cos(mass_phi1);
    double sinphi1 = sin(mass_phi1);
    double EImyy1 = EIyy1 * cosphi1 + EIzz1 * sinphi1;
    double EImzz1 = -EIyy1 * sinphi1 + EIzz1 * cosphi1;
    double GAmyy1 = GAyy1 * cosphi1 + GAzz1 * sinphi1;
    double GAmzz1 = -GAyy1 * sinphi1 + GAzz1 * cosphi1;
    DampingCoefficients rdamping_coeff1 = this->sectionA->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping1 = this->sectionA->GetArtificialFactorForShearDamping();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    // double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();
    // double Jmxx2 = this->sectionB->GetInertiaJxxPerUnitLengthInMassReference();
    double EA2 = this->sectionB->GetAxialRigidity();
    double GJ2 = this->sectionB->GetXtorsionRigidity();
    double EIyy2 = this->sectionB->GetYbendingRigidity();
    double EIzz2 = this->sectionB->GetZbendingRigidity();
    double GAyy2 = this->sectionB->GetYshearRigidity();
    double GAzz2 = this->sectionB->GetZshearRigidity();
    double alpha2 = this->sectionB->GetSectionRotation();
    double Cy2 = this->sectionB->GetCentroidY();
    double Cz2 = this->sectionB->GetCentroidZ();
    double Sy2 = this->sectionB->GetShearCenterY();
    double Sz2 = this->sectionB->GetShearCenterZ();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmyy2;
    double Jmzz2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    // double Jmxx2 = Jmyy2 + Jmzz2;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi2 = cos(mass_phi2);
    double sinphi2 = sin(mass_phi2);
    double EImyy2 = EIyy2 * cosphi2 + EIzz2 * sinphi2;
    double EImzz2 = -EIyy2 * sinphi2 + EIzz2 * cosphi2;
    double GAmyy2 = GAyy2 * cosphi2 + GAzz2 * sinphi2;
    double GAmzz2 = -GAyy2 * sinphi2 + GAzz2 * cosphi2;
    DampingCoefficients rdamping_coeff2 = this->sectionB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping2 = this->sectionB->GetArtificialFactorForShearDamping();

    double L = this->GetLength();
    double LL = L * L;

    this->avg_sec_par->mu = GetAverageValue(mu1, mu2);
    this->avg_sec_par->alpha = GetAverageValue(alpha1, alpha2);
    this->avg_sec_par->Cy = GetAverageValue(Cy1, Cy2);
    this->avg_sec_par->Cz = GetAverageValue(Cz1, Cz2);
    this->avg_sec_par->Sy = GetAverageValue(Sy1, Sy2);
    this->avg_sec_par->Sz = GetAverageValue(Sz1, Sz2);
    this->avg_sec_par->My = GetAverageValue(My1, My2);
    this->avg_sec_par->Mz = GetAverageValue(Mz1, Mz2);

    this->avg_sec_par->Jyy = GetAverageValue5(Jyy1, Jyy2);
    this->avg_sec_par->Jzz = GetAverageValue5(Jzz1, Jzz2);
    this->avg_sec_par->Jyz = GetAverageValue5(Jyz1, Jyz2);  // Jyz may be negative
    this->avg_sec_par->Jxx = this->avg_sec_par->Jyy + this->avg_sec_par->Jzz;
    this->avg_sec_par->Qy = GetAverageValue3(Qy1, Qy2);  // Qy may be negative
    this->avg_sec_par->Qz = GetAverageValue3(Qz1, Qz2);  // Qz may be negative

    this->avg_sec_par->mass_phi = GetAverageValue(mass_phi1, mass_phi2);
    this->avg_sec_par->Jmyy = GetAverageValue5(Jmyy1, Jmyy2);
    this->avg_sec_par->Jmzz = GetAverageValue5(Jmzz1, Jmzz2);
    this->avg_sec_par->Jmyz = GetAverageValue5(Jmyz1, Jmyz2);  // Jyz may be negative
    this->avg_sec_par->Jmxx = this->avg_sec_par->Jmyy + this->avg_sec_par->Jmzz;
    this->avg_sec_par->Qmy = GetAverageValue3(Qmy1, Qmy2);  // Qy may be negative
    this->avg_sec_par->Qmz = GetAverageValue3(Qmz1, Qmz2);  // Qz may be negative

    this->avg_sec_par->EA = GetAverageValue3(EA1, EA2);
    this->avg_sec_par->GJ = GetAverageValue3(GJ1, GJ2);
    this->avg_sec_par->GAyy = GetAverageValue5(GAyy1, GAyy2);
    this->avg_sec_par->GAzz = GetAverageValue5(GAzz1, GAzz2);
    this->avg_sec_par->EIyy = GetAverageValue5(EIyy1, EIyy2);
    this->avg_sec_par->EIzz = GetAverageValue5(EIzz1, EIzz2);

    this->avg_sec_par->GAmyy = GetAverageValue5(GAmyy1, GAmyy2);
    this->avg_sec_par->GAmzz = GetAverageValue5(GAmzz1, GAmzz2);
    this->avg_sec_par->EImyy = GetAverageValue5(EImyy1, EImyy2);
    this->avg_sec_par->EImzz = GetAverageValue5(EImzz1, EImzz2);

    this->avg_sec_par->rdamping_coeff.bx = GetAverageValue(rdamping_coeff1.bx, rdamping_coeff2.bx);
    this->avg_sec_par->rdamping_coeff.by = GetAverageValue(rdamping_coeff1.by, rdamping_coeff2.by);
    this->avg_sec_par->rdamping_coeff.bz = GetAverageValue(rdamping_coeff1.bz, rdamping_coeff2.bz);
    this->avg_sec_par->rdamping_coeff.bt = GetAverageValue(rdamping_coeff1.bt, rdamping_coeff2.bt);
    this->avg_sec_par->rdamping_coeff.alpha = GetAverageValue(rdamping_coeff1.alpha, rdamping_coeff2.alpha);
    this->avg_sec_par->artificial_factor_for_shear_damping =
        GetAverageValue(artificial_factor_for_shear_damping1, artificial_factor_for_shear_damping2);

    this->avg_sec_par->phimy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phimz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    double eps = 0.01;
    if (abs(this->avg_sec_par->GAmyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimy = 12.0 * this->avg_sec_par->EImzz / (this->avg_sec_par->GAmyy * LL);
    }
    if (abs(this->avg_sec_par->GAmzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimz = 12.0 * this->avg_sec_par->EImyy / (this->avg_sec_par->GAmzz * LL);
    }

    this->avg_sec_par->phiy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phiz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    if (abs(this->avg_sec_par->GAyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiy = 12.0 * this->avg_sec_par->EIzz / (this->avg_sec_par->GAyy * LL);
    }
    if (abs(this->avg_sec_par->GAzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiz = 12.0 * this->avg_sec_par->EIyy / (this->avg_sec_par->GAzz * LL);
    }
    
    // update the status of lock, to avoid computing again.
    compute_ave_sec_par = true;
}